

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::Image::Context::Context
          (Context *this,EglTestContext *eglTestCtx,EGLDisplay display,ContextType ctxType,int width
          ,int height)

{
  EGLDisplay display_00;
  EGLSurface draw;
  ManagedSurface *pMVar1;
  Library *pLVar2;
  EGLConfig pvVar3;
  Library *egl;
  EGLContext context;
  ApiType local_4c;
  UniqueContext *local_48;
  MovePtr<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
  local_40;
  
  this->m_eglTestCtx = eglTestCtx;
  this->m_display = display;
  local_4c = ctxType.super_ApiType.m_bits;
  pLVar2 = EglTestContext::getLibrary(eglTestCtx);
  pvVar3 = chooseConfig(pLVar2,display,(ApiType)(local_4c.m_bits & 0x3ff));
  this->m_config = pvVar3;
  pLVar2 = EglTestContext::getLibrary(this->m_eglTestCtx);
  display_00 = this->m_display;
  egl = EglTestContext::getLibrary(eglTestCtx);
  context = eglu::createGLContext
                      (egl,this->m_display,this->m_config,(ContextType *)&local_4c,
                       RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED);
  local_48 = &this->m_context;
  eglu::UniqueContext::UniqueContext(&this->m_context,pLVar2,display_00,context);
  createSurface(&local_40,eglTestCtx,this->m_display,this->m_config,width,height);
  pMVar1 = local_40.
           super_UniqueBase<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
           .m_data.ptr;
  local_40.
  super_UniqueBase<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
  .m_data.ptr = (ManagedSurface *)0x0;
  (this->m_surface).
  super_UniqueBase<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
  .m_data.ptr = pMVar1;
  pLVar2 = EglTestContext::getLibrary(eglTestCtx);
  draw = ((((this->m_surface).
            super_UniqueBase<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
            .m_data.ptr)->m_surface).
          super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.ptr
         )->m_surface;
  eglu::ScopedCurrentContext::ScopedCurrentContext
            (&this->m_current,pLVar2,this->m_display,draw,draw,(this->m_context).m_context);
  glw::Functions::Functions(&this->m_gl);
  EglTestContext::initGLFunctions(this->m_eglTestCtx,&this->m_gl,(ApiType)(local_4c.m_bits & 0x3ff))
  ;
  return;
}

Assistant:

Context			(EglTestContext& eglTestCtx, EGLDisplay display, ContextType ctxType, int width, int height)
									: m_eglTestCtx	(eglTestCtx)
									, m_display		(display)
									, m_config		(chooseConfig(eglTestCtx.getLibrary(), display, ctxType.getAPI()))
									, m_context		(m_eglTestCtx.getLibrary(), m_display, eglu::createGLContext(eglTestCtx.getLibrary(), m_display, m_config, ctxType))
									, m_surface		(createSurface(eglTestCtx, m_display, m_config, width, height))
									, m_current		(eglTestCtx.getLibrary(), m_display, m_surface->get(), m_surface->get(), *m_context)
	{
		m_eglTestCtx.initGLFunctions(&m_gl, ctxType.getAPI());
	}